

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trip.c
# Opt level: O1

feed_db_status_t store_trip_db(trip_t *record,feed_db_t *db)

{
  int iVar1;
  char *pcVar2;
  sqlite3_stmt *stmt;
  char qr [198];
  sqlite3_stmt *local_100;
  char local_f8 [208];
  
  memcpy(local_f8,
         "INSERT INTO trips (route_id, service_id, trip_id,trip_headsign, trip_short_name,direction_id, block_id, shape_id,wheelchair_accessible, bikes_allowed) values (?1, ?2, ?3,?4, ?5,?6, ?7, ?8,?9, ?10);"
         ,0xc6);
  sqlite3_prepare_v2(db->conn,local_f8,-1,&local_100,(char **)0x0);
  sqlite3_bind_text(local_100,1,record->route_id,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(local_100,2,record->service_id,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(local_100,3,record->id,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(local_100,4,record->headsign,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(local_100,5,record->short_name,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_int(local_100,6,record->direction_id);
  sqlite3_bind_text(local_100,7,record->block_id,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(local_100,8,record->shape_id,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_int(local_100,9,record->wheelchair_accessible);
  sqlite3_bind_int(local_100,10,record->bikes_allowed);
  iVar1 = sqlite3_step(local_100);
  db->rc = iVar1;
  if (iVar1 != 0x65) {
    pcVar2 = sqlite3_errmsg(db->conn);
    pcVar2 = strdup(pcVar2);
    db->error_msg = pcVar2;
  }
  sqlite3_finalize(local_100);
  return (uint)(iVar1 == 0x65);
}

Assistant:

feed_db_status_t store_trip_db(trip_t *record, feed_db_t *db) {
    sqlite3_stmt *stmt;
    char qr[] = "INSERT INTO trips ("
                    "route_id, service_id, trip_id,"
                    "trip_headsign, trip_short_name,"
                    "direction_id, block_id, shape_id,"
                    "wheelchair_accessible, bikes_allowed"
                ") values ("
                    "?1, ?2, ?3,"
                    "?4, ?5,"
                    "?6, ?7, ?8,"
                    "?9, ?10"
                ");";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    sqlite3_bind_text(stmt, 1, record->route_id, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 2, record->service_id, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 3, record->id, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 4, record->headsign, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 5, record->short_name, -1, SQLITE_STATIC);
    sqlite3_bind_int(stmt, 6, record->direction_id);
    sqlite3_bind_text(stmt, 7, record->block_id, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 8, record->shape_id, -1, SQLITE_STATIC);
    sqlite3_bind_int(stmt, 9, (int)record->wheelchair_accessible);
    sqlite3_bind_int(stmt, 10, (int)record->bikes_allowed);

    db->rc = sqlite3_step(stmt);
    if (db->rc != SQLITE_DONE) {
        db->error_msg = strdup(sqlite3_errmsg(db->conn));
        sqlite3_finalize(stmt);
        return FEED_DB_ERROR;
    }

    sqlite3_finalize(stmt);
    return FEED_DB_SUCCESS;
}